

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdate.cpp
# Opt level: O1

CVmTimeZone * CVmObjDate::get_tz_arg(uint argn,uint argc)

{
  vm_val_t *argp;
  vm_datatype_t vVar1;
  vm_val_t *pvVar2;
  int iVar3;
  CVmTimeZone *pCVar4;
  char *pcVar5;
  
  pvVar2 = sp_;
  if (argc == argn) {
LAB_00259fa9:
    pCVar4 = CVmTimeZoneCache::get_local_zone(G_tzcache_X);
    return pCVar4;
  }
  argp = sp_ + (-1 - (ulong)argn);
  vVar1 = argp->typ;
  if (vVar1 == VM_NIL) goto LAB_00259fa9;
  if (argc < argn || argc - argn == 0) goto LAB_0025a042;
  if (vVar1 == VM_OBJ) {
    iVar3 = (**(code **)(*(long *)&G_obj_table_X.pages_[sp_[-1 - (ulong)argn].val.obj >> 0xc]
                                   [sp_[-1 - (ulong)argn].val.obj & 0xfff].ptr_ + 8))
                      (G_obj_table_X.pages_[sp_[-1 - (ulong)argn].val.obj >> 0xc] +
                       (sp_[-1 - (ulong)argn].val.obj & 0xfff),CVmObjTimeZone::metaclass_reg_);
    if (iVar3 == 0) goto LAB_0025a028;
    pcVar5 = (G_obj_table_X.pages_[pvVar2[-1 - (ulong)argn].val.obj >> 0xc]->ptr_).obj_ +
             (pvVar2[-1 - (ulong)argn].val.obj & 0xfff) * 0x18;
  }
  else {
LAB_0025a028:
    pcVar5 = (char *)0x0;
  }
  if (pcVar5 != (char *)0x0) {
    return (CVmTimeZone *)**(undefined8 **)(pcVar5 + 8);
  }
LAB_0025a042:
  pCVar4 = CVmObjTimeZone::parse_ctor_args(argp,argc - argn);
  return pCVar4;
}

Assistant:

CVmTimeZone *CVmObjDate::get_tz_arg(VMG_ uint argn, uint argc)
{
    /* if the argument is nil or missing, use the default local zone */
    vm_val_t *argp = G_stk->get(argn);
    if (argn == argc || argp->typ == VM_NIL)
        return G_tzcache->get_local_zone(vmg0_);

    /* check for a TimeZone object */
    CVmObjTimeZone *tzobj;
    if (argn < argc && (tzobj = vm_val_cast(CVmObjTimeZone, argp)) != 0)
        return tzobj->get_tz();

    /* otherwise, accept anything that the TimeZone constructor accepts */
    return CVmObjTimeZone::parse_ctor_args(vmg_ argp, argc - argn);
}